

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O0

LY_ERR ly_in_new_filepath(char *filepath,size_t len,ly_in **in)

{
  int fd_00;
  int *piVar1;
  char *pcVar2;
  char *pcStack_38;
  int fd;
  char *fp;
  LY_ERR ret;
  ly_in **in_local;
  size_t len_local;
  char *filepath_local;
  
  if (filepath == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","filepath",
           "ly_in_new_filepath");
    filepath_local._4_4_ = LY_EINVAL;
  }
  else if (in == (ly_in **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in","ly_in_new_filepath")
    ;
    filepath_local._4_4_ = LY_EINVAL;
  }
  else {
    if (len == 0) {
      pcStack_38 = strdup(filepath);
    }
    else {
      pcStack_38 = strndup(filepath,len);
    }
    fd_00 = open(pcStack_38,0);
    if (fd_00 == -1) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Failed to open file \"%s\" (%s).",pcStack_38,pcVar2);
      free(pcStack_38);
      filepath_local._4_4_ = LY_ESYS;
    }
    else {
      filepath_local._4_4_ = ly_in_new_fd(fd_00,in);
      if (filepath_local._4_4_ == LY_SUCCESS) {
        (*in)->type = LY_IN_FILEPATH;
        ((*in)->method).fd = fd_00;
        ((*in)->method).fpath.filepath = pcStack_38;
        filepath_local._4_4_ = LY_SUCCESS;
      }
      else {
        free(pcStack_38);
      }
    }
  }
  return filepath_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_in_new_filepath(const char *filepath, size_t len, struct ly_in **in)
{
    LY_ERR ret;
    char *fp;
    int fd;

    LY_CHECK_ARG_RET(NULL, filepath, in, LY_EINVAL);

    if (len) {
        fp = strndup(filepath, len);
    } else {
        fp = strdup(filepath);
    }

    fd = open(fp, O_RDONLY);
    LY_CHECK_ERR_RET(fd == -1, LOGERR(NULL, LY_ESYS, "Failed to open file \"%s\" (%s).", fp, strerror(errno)); free(fp),
            LY_ESYS);

    LY_CHECK_ERR_RET(ret = ly_in_new_fd(fd, in), free(fp), ret);

    /* convert the LY_IN_FD input handler into the LY_IN_FILE */
    (*in)->type = LY_IN_FILEPATH;
    (*in)->method.fpath.fd = fd;
    (*in)->method.fpath.filepath = fp;

    return LY_SUCCESS;
}